

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

ssize_t __thiscall
soplex::SPxLPBase<double>::read(SPxLPBase<double> *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  long lVar2;
  char c;
  char local_31;
  
  std::istream::get((char *)CONCAT44(in_register_00000034,__fd));
  std::istream::putback((char)__fd);
  local_31 = (char)((ulong)in_RAX >> 0x38);
  lVar2 = 0xe8;
  if (local_31 != 'N') {
    lVar2 = (ulong)(local_31 == '*') * 8 + 0xe0;
  }
  sVar1 = (**(code **)((long)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                             super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar2))
                    (this,(char *)CONCAT44(in_register_00000034,__fd),__buf,__nbytes);
  return sVar1;
}

Assistant:

virtual bool read(std::istream& in, NameSet* rowNames = nullptr, NameSet* colNames = nullptr,
                     DIdxSet* intVars  = nullptr)
   {
      bool ok;
      char c;

      in.get(c);
      in.putback(c);

      /* MPS starts either with a comment mark '*' or with the keyword 'NAME' at the first column.  LPF starts either
       * with blanks, a comment mark '\' or with the keyword "MAX" or "MIN" in upper or lower case.  There is no
       * possible valid LPF file starting with a '*' or 'N'.
       */
      ok = ((c == '*') || (c == 'N'))
           ? readMPS(in, rowNames, colNames, intVars)
           : readLPF(in, rowNames, colNames, intVars);

      return ok;
   }